

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# doctest.h
# Opt level: O0

String * doctest::detail::stringifyBinaryExpr<unsigned_int,unsigned_long>
                   (uint *lhs,char *op,unsigned_long *rhs)

{
  String *in_RDI;
  String *in_stack_ffffffffffffff70;
  String *in_stack_ffffffffffffffa0;
  undefined4 in_stack_ffffffffffffffa8;
  uint in_stack_ffffffffffffffac;
  
  doctest::toString(in_stack_ffffffffffffffac);
  String::String(in_stack_ffffffffffffff70,(char *)in_RDI);
  String::operator+((String *)CONCAT44(in_stack_ffffffffffffffac,in_stack_ffffffffffffffa8),
                    in_stack_ffffffffffffffa0);
  doctest::toString(CONCAT44(in_stack_ffffffffffffffac,in_stack_ffffffffffffffa8));
  String::operator+((String *)CONCAT44(in_stack_ffffffffffffffac,in_stack_ffffffffffffffa8),
                    in_stack_ffffffffffffffa0);
  String::~String(in_stack_ffffffffffffff70);
  String::~String(in_stack_ffffffffffffff70);
  String::~String(in_stack_ffffffffffffff70);
  String::~String(in_stack_ffffffffffffff70);
  return in_RDI;
}

Assistant:

String stringifyBinaryExpr(const DOCTEST_REF_WRAP(L) lhs, const char* op,
                               const DOCTEST_REF_WRAP(R) rhs) {
        // NOLINTNEXTLINE(clang-analyzer-cplusplus.NewDeleteLeaks)
        return toString(lhs) + op + toString(rhs);
    }